

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O0

bool __thiscall
glcts::DrawBuffersIndexedColorMasks::VerifyImg
          (DrawBuffersIndexedColorMasks *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  int iVar1;
  int b;
  bool bVar2;
  int iVar3;
  int *piVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  MessageBuilder local_1f8;
  deUint32 local_78;
  deUint32 local_74;
  deUint32 local_70;
  RGBA local_6c;
  RGBA pixel;
  undefined1 local_40 [8];
  IVec4 color;
  int x;
  int y;
  TextureLevel *textureLevel_local;
  DrawBuffersIndexedColorMasks *this_local;
  RGBA local_10;
  RGBA epsilon_local;
  RGBA expectedColor_local;
  
  color.m_data[3] = 0;
  this_local._4_4_ = epsilon.m_value;
  local_10.m_value = expectedColor.m_value;
  do {
    iVar1 = color.m_data[3];
    iVar3 = tcu::TextureLevel::getHeight(textureLevel);
    if (iVar3 <= iVar1) {
      return true;
    }
    for (color.m_data[2] = 0; iVar1 = color.m_data[2],
        iVar3 = tcu::TextureLevel::getWidth(textureLevel), iVar1 < iVar3;
        color.m_data[2] = color.m_data[2] + 1) {
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&stack0xffffffffffffff98,textureLevel);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_40,(int)&stack0xffffffffffffff98,color.m_data[2],
                 color.m_data[3]);
      piVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
      iVar1 = *piVar4;
      piVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_40);
      iVar3 = *piVar4;
      piVar4 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_40);
      b = *piVar4;
      piVar4 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_40);
      tcu::RGBA::RGBA(&local_6c,iVar1,iVar3,b,*piVar4);
      local_70 = local_6c.m_value;
      local_74 = local_10.m_value;
      local_78 = this_local._4_4_;
      bVar2 = tcu::compareThreshold(local_6c,local_10,this_local._4_4_);
      if (!bVar2) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                             super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1f8,(char (*) [17])0x2ad0d0c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_10);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"Read value:     ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"Epsilon:        ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(RGBA *)((long)&this_local + 4));
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1f8);
        return false;
      }
    }
    color.m_data[3] = color.m_data[3] + 1;
  } while( true );
}

Assistant:

bool DrawBuffersIndexedColorMasks::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
											 tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::IVec4 color(textureLevel.getAccess().getPixelInt(x, y));
			tcu::RGBA  pixel(color.x(), color.y(), color.z(), color.w());

			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}